

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O2

int diff_hdrs(nifti_1_header *s0,nifti_1_header *s1,int display)

{
  field_s *fieldp;
  int iVar1;
  long lVar2;
  int iVar3;
  
  iVar3 = 0;
  for (lVar2 = 0; (int)lVar2 != 0x60c; lVar2 = lVar2 + 0x24) {
    fieldp = (field_s *)(g_hdr_fields[0].name + lVar2 + -0x10);
    iVar1 = diff_field(fieldp,s0,s1,1);
    if (iVar1 != 0) {
      if (display != 0) {
        disp_field((char *)0x0,fieldp,s0,1,(uint)(iVar3 == 0));
        disp_field((char *)0x0,fieldp,s1,1,0);
      }
      iVar3 = iVar3 + 1;
    }
  }
  return iVar3;
}

Assistant:

int diff_hdrs( nifti_1_header * s0, nifti_1_header * s1, int display )
{
   field_s * fp = g_hdr_fields;
   int       c, ndiff = 0;

   for( c = 0; c < NT_HDR_NUM_FIELDS; c++, fp++ )
      if( diff_field(fp, s0, s1, 1) )
      {
         if( display ) disp_field(NULL, fp, s0, 1, ndiff == 0);
         if( display ) disp_field(NULL, fp, s1, 1, 0);
         ndiff++;
      }

   return ndiff;
}